

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckMemberFunctions.cxx
# Opt level: O2

bool __thiscall kws::Parser::CheckMemberFunctions(Parser *this,char *regEx,unsigned_long maxLength)

{
  string *buffer_00;
  string *psVar1;
  pointer pcVar2;
  bool bVar3;
  char cVar4;
  long lVar5;
  char *pcVar6;
  size_t sVar7;
  ostream *poVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  size_t sVar13;
  ulong uVar14;
  pointer pbVar15;
  ulong pos;
  ulong uVar16;
  byte bVar17;
  string buffer;
  string headerfile;
  string classname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  classes;
  size_t current;
  string functionLine;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  ifstream file;
  string local_550 [8];
  size_type local_548;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_540 [30];
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  RegularExpression regex;
  
  this->m_TestsDone[0x1c] = true;
  std::__cxx11::string::assign((char *)(this->m_TestsDescription + 0x1c));
  std::__cxx11::string::append((char *)(this->m_TestsDescription + 0x1c));
  if (maxLength != 0) {
    this->m_TestsDone[0x1d] = true;
    psVar1 = (string *)(this->m_TestsDescription + 0x1d);
    std::__cxx11::string::assign((char *)psVar1);
    std::__cxx11::to_string((string *)&regex,maxLength);
    std::__cxx11::string::append(psVar1);
    std::__cxx11::string::~string((string *)&regex);
    std::__cxx11::string::append((char *)psVar1);
  }
  kwssys::RegularExpression::RegularExpression(&regex,regEx);
  classes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  classes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  classes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string
            ((string *)&headerfile,(this->m_Filename)._M_dataplus._M_p,(allocator *)&buffer);
  kwssys::SystemTools::GetFilenameExtension((string *)&file,&headerfile);
  bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file
                          ,".h");
  std::__cxx11::string::~string((string *)&file);
  std::__cxx11::string::~string((string *)&headerfile);
  if (bVar3) {
    std::__cxx11::string::string
              ((string *)&file,(this->m_Filename)._M_dataplus._M_p,(allocator *)&buffer);
    kwssys::SystemTools::GetFilenamePath(&headerfile,(string *)&file);
    std::__cxx11::string::~string((string *)&file);
    std::__cxx11::string::string
              ((string *)&buffer,(this->m_Filename)._M_dataplus._M_p,(allocator *)&classname);
    kwssys::SystemTools::GetFilenameWithoutExtension((string *)&file,&buffer);
    std::__cxx11::string::append((string *)&headerfile);
    std::__cxx11::string::~string((string *)&file);
    std::__cxx11::string::~string((string *)&buffer);
    std::__cxx11::string::append((char *)&headerfile);
    bVar3 = kwssys::SystemTools::FileExists(headerfile._M_dataplus._M_p);
    if (bVar3) {
      std::ifstream::ifstream(&file);
      std::ifstream::open((char *)&file,(_Ios_Openmode)headerfile._M_dataplus._M_p);
      cVar4 = std::__basic_file<char>::is_open();
      if (cVar4 == '\0') {
        poVar8 = std::operator<<((ostream *)&std::cout,"Cannot open file: ");
        poVar8 = std::operator<<(poVar8,headerfile._M_dataplus._M_p);
        std::endl<char,std::char_traits<char>>(poVar8);
      }
      else {
        std::istream::seekg((long)&file,_S_beg);
        lVar5 = std::istream::tellg();
        std::istream::seekg((long)&file,_S_beg);
        pcVar6 = (char *)operator_new__(lVar5 + 1);
        std::istream::read((char *)&file,(long)pcVar6);
        pcVar6[lVar5] = '\0';
        std::__cxx11::string::string((string *)&buffer,pcVar6,(allocator *)&classname);
        std::__cxx11::string::resize((ulong)&buffer);
        operator_delete__(pcVar6);
        std::ifstream::close();
        ConvertBufferToWindowsFileType(this,&buffer);
        RemoveComments_abi_cxx11_(&classname,this,buffer._M_dataplus._M_p);
        std::__cxx11::string::operator=((string *)&buffer,(string *)&classname);
        std::__cxx11::string::~string((string *)&classname);
        std::__cxx11::string::string((string *)&local_340,(string *)&buffer);
        sVar7 = GetClassPosition(this,0,&local_340);
        std::__cxx11::string::~string((string *)&local_340);
        while (sVar7 != 0xffffffffffffffff) {
          std::__cxx11::string::string((string *)&local_280,(string *)&buffer);
          FindPreviousWord(&classname,this,sVar7,false,&local_280);
          std::__cxx11::string::~string((string *)&local_280);
          if ((buffer._M_dataplus._M_p[sVar7 - 1] != ' ') &&
             ((this->m_BufferNoComment)._M_dataplus._M_p[sVar7 - 1] != '\n')) {
            std::__cxx11::string::assign((char *)&classname);
            sVar13 = sVar7;
            while ((sVar13 != 0 && (buffer._M_dataplus._M_p[sVar13 - 1] != ' '))) {
              std::operator+(&functionLine,buffer._M_dataplus._M_p[sVar13 - 1],&classname);
              std::__cxx11::string::operator=((string *)&classname,(string *)&functionLine);
              std::__cxx11::string::~string((string *)&functionLine);
              sVar13 = sVar13 - 1;
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&classes,&classname);
          std::__cxx11::string::string((string *)&local_2a0,(string *)&buffer);
          sVar7 = GetClassPosition(this,sVar7 + 1,&local_2a0);
          std::__cxx11::string::~string((string *)&local_2a0);
          std::__cxx11::string::~string((string *)&classname);
        }
        std::__cxx11::string::~string((string *)&buffer);
      }
      std::ifstream::~ifstream(&file);
      if (cVar4 == '\0') {
        std::__cxx11::string::~string((string *)&headerfile);
        bVar3 = true;
        goto LAB_001487c5;
      }
    }
    std::__cxx11::string::~string((string *)&headerfile);
  }
  std::__cxx11::string::string((string *)&local_360,"",(allocator *)&file);
  sVar7 = GetClassPosition(this,0,&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  buffer_00 = &this->m_BufferNoComment;
  bVar17 = 0;
  while (pbVar15 = classes.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start, sVar7 != 0xffffffffffffffff) {
    sVar13 = sVar7 + 1;
    sVar9 = FindEndOfClass(this,sVar13);
    FindMemberFunction(&headerfile,this,buffer_00,sVar7,sVar9,&current);
    std::__cxx11::string::string((string *)&local_2c0,"",(allocator *)&file);
    FindPreviousWord(&buffer,this,sVar7,false,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    cVar4 = (buffer_00->_M_dataplus)._M_p[sVar7 - 1];
    if ((cVar4 != '\n') && (cVar4 != ' ')) {
      std::__cxx11::string::assign((char *)&buffer);
      while ((sVar7 != 0 && (cVar4 = (buffer_00->_M_dataplus)._M_p[sVar7 - 1], cVar4 != ' '))) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                       cVar4,&buffer);
        std::__cxx11::string::operator=((string *)&buffer,(string *)&file);
        std::__cxx11::string::~string((string *)&file);
        sVar7 = sVar7 - 1;
      }
    }
    std::__cxx11::string::string((string *)&classname,"~",(allocator *)&file);
    std::__cxx11::string::append((string *)&classname);
    while (sVar7 = current, current != 0xffffffffffffffff) {
      bVar3 = std::operator!=(&headerfile,&buffer);
      if ((bVar3) && (bVar3 = std::operator!=(&headerfile,&classname), bVar3)) {
        bVar3 = kwssys::RegularExpression::find(&regex,headerfile._M_dataplus._M_p);
        if (!bVar3) {
          local_550 = (string  [8])local_540;
          local_548 = 0;
          local_540[0]._M_local_buf[0] = '\0';
          _file = (pointer)GetLineNumber(this,sVar7,true);
          std::operator+(&local_588,"member function (",&headerfile);
          std::operator+(&functionLine,&local_588,") doesn\'t match regular expression");
          std::__cxx11::string::operator=(local_550,(string *)&functionLine);
          std::__cxx11::string::~string((string *)&functionLine);
          std::__cxx11::string::~string((string *)&local_588);
          std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                    (&this->m_ErrorList,(value_type *)&file);
          std::__cxx11::string::~string(local_550);
          bVar17 = 1;
        }
        if (maxLength != 0) {
          uVar10 = std::__cxx11::string::find((char *)buffer_00,0x154cbe);
          uVar11 = std::__cxx11::string::find((char *)buffer_00,0x161d46);
          if (uVar10 < uVar11) {
            std::__cxx11::string::string((string *)&local_2e0,"",(allocator *)&file);
            sVar9 = FindClosingChar(this,'{','}',uVar10,true,&local_2e0);
            std::__cxx11::string::~string((string *)&local_2e0);
            lVar5 = GetLineNumber(this,uVar10,false);
            lVar12 = GetLineNumber(this,sVar9,false);
            if ((sVar9 != 0xffffffffffffffff) && (maxLength < (ulong)(lVar12 - lVar5))) {
              local_550 = (string  [8])local_540;
              local_548 = 0;
              local_540[0]._M_local_buf[0] = '\0';
              _file = (pointer)GetLineNumber(this,sVar7,true);
              std::operator+(&local_588,"function (",&headerfile);
              std::operator+(&functionLine,&local_588,") has too many lines: ");
              std::__cxx11::string::operator=(local_550,(string *)&functionLine);
              std::__cxx11::string::~string((string *)&functionLine);
              std::__cxx11::string::~string((string *)&local_588);
              pcVar6 = (char *)operator_new__(10);
              snprintf(pcVar6,10,"%zd",lVar12 - lVar5);
              std::__cxx11::string::append((char *)local_550);
              std::__cxx11::string::append((char *)local_550);
              snprintf(pcVar6,10,"%ld",maxLength);
              std::__cxx11::string::append((char *)local_550);
              std::__cxx11::string::append((char *)local_550);
              std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                        (&this->m_ErrorList,(value_type *)&file);
              operator_delete__(pcVar6);
              std::__cxx11::string::~string(local_550);
              bVar17 = 1;
            }
          }
        }
      }
      sVar9 = FindEndOfClass(this,sVar13);
      FindMemberFunction((string *)&file,this,buffer_00,sVar7 + 1,sVar9,&current);
      std::__cxx11::string::operator=((string *)&headerfile,(string *)&file);
      std::__cxx11::string::~string((string *)&file);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&classes,&buffer);
    std::__cxx11::string::string((string *)&local_300,"",(allocator *)&file);
    sVar7 = GetClassPosition(this,sVar13,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&classname);
    std::__cxx11::string::~string((string *)&buffer);
    std::__cxx11::string::~string((string *)&headerfile);
  }
  for (; pbVar15 !=
         classes.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish; pbVar15 = pbVar15 + 1) {
    std::__cxx11::string::string((string *)&headerfile,(string *)pbVar15);
LAB_00148324:
    lVar5 = std::__cxx11::string::find((string *)buffer_00,(ulong)&headerfile);
    if (lVar5 != -1) {
      uVar10 = std::__cxx11::string::find((char *)buffer_00,0x162e42);
      if (uVar10 != 0xffffffffffffffff) {
        pcVar2 = (buffer_00->_M_dataplus)._M_p;
        for (uVar11 = headerfile._M_string_length + lVar5; uVar11 < uVar10; uVar11 = uVar11 + 1) {
          uVar14 = (ulong)(byte)pcVar2[uVar11];
          if ((0x20 < uVar14) || ((0x100002400U >> (uVar14 & 0x3f) & 1) == 0)) goto LAB_00148324;
        }
        uVar10 = uVar10 + 2;
        uVar11 = (this->m_BufferNoComment)._M_string_length;
        uVar14 = uVar10;
        if (uVar10 < uVar11) {
          uVar14 = uVar11;
        }
        while (((pos = uVar14, uVar10 < uVar11 &&
                (uVar16 = (ulong)(byte)pcVar2[uVar10], pos = uVar10, uVar16 < 0x21)) &&
               ((0x100002400U >> (uVar16 & 0x3f) & 1) != 0))) {
          uVar10 = uVar10 + 1;
        }
        sVar7 = std::__cxx11::string::find((char *)buffer_00,0x161d52);
        if (sVar7 != 0xffffffffffffffff) {
          std::__cxx11::string::substr((ulong)&buffer,(ulong)buffer_00);
          std::__cxx11::string::string((string *)&classname,"~",(allocator *)&file);
          std::__cxx11::string::append((string *)&classname);
          lVar5 = GetLineNumber(this,pos,true);
          GetLine_abi_cxx11_(&functionLine,this,lVar5 - 1);
          bVar3 = std::operator!=(&buffer,&headerfile);
          if (((bVar3) && (bVar3 = std::operator!=(&buffer,&classname), bVar3)) &&
             (lVar5 = std::__cxx11::string::find((char *)&functionLine,0x162e45), lVar5 == -1)) {
            bVar3 = kwssys::RegularExpression::find(&regex,buffer._M_dataplus._M_p);
            if (!bVar3) {
              local_550 = (string  [8])local_540;
              local_548 = 0;
              local_540[0]._M_local_buf[0] = '\0';
              _file = (pointer)GetLineNumber(this,pos,true);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &current,"function (",&buffer);
              std::operator+(&local_588,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &current,") doesn\'t match regular expression");
              std::__cxx11::string::operator=(local_550,(string *)&local_588);
              std::__cxx11::string::~string((string *)&local_588);
              std::__cxx11::string::~string((string *)&current);
              std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                        (&this->m_ErrorList,(value_type *)&file);
              std::__cxx11::string::~string(local_550);
              bVar17 = 1;
            }
            if (maxLength != 0) {
              sVar13 = std::__cxx11::string::find((char *)buffer_00,0x154cbe);
              std::__cxx11::string::string((string *)&local_320,"",(allocator *)&file);
              sVar9 = FindClosingChar(this,'{','}',sVar13,true,&local_320);
              std::__cxx11::string::~string((string *)&local_320);
              lVar5 = GetLineNumber(this,sVar13,false);
              lVar12 = GetLineNumber(this,sVar9,false);
              if ((sVar9 != 0xffffffffffffffff && sVar13 != 0xffffffffffffffff) &&
                 (maxLength < (ulong)(lVar12 - lVar5))) {
                local_550 = (string  [8])local_540;
                local_548 = 0;
                local_540[0]._M_local_buf[0] = '\0';
                _file = (pointer)GetLineNumber(this,sVar7,true);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &current,"function (",&buffer);
                std::operator+(&local_588,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &current,") has too many lines: ");
                std::__cxx11::string::operator=(local_550,(string *)&local_588);
                std::__cxx11::string::~string((string *)&local_588);
                std::__cxx11::string::~string((string *)&current);
                pcVar6 = (char *)operator_new__(10);
                snprintf(pcVar6,10,"%zd",lVar12 - lVar5);
                std::__cxx11::string::append((char *)local_550);
                std::__cxx11::string::append((char *)local_550);
                snprintf(pcVar6,10,"%ld",maxLength);
                std::__cxx11::string::append((char *)local_550);
                std::__cxx11::string::append((char *)local_550);
                std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                          (&this->m_ErrorList,(value_type *)&file);
                operator_delete__(pcVar6);
                std::__cxx11::string::~string(local_550);
                bVar17 = 1;
              }
            }
          }
          std::__cxx11::string::~string((string *)&functionLine);
          std::__cxx11::string::~string((string *)&classname);
          std::__cxx11::string::~string((string *)&buffer);
        }
      }
      goto LAB_00148324;
    }
    std::__cxx11::string::~string((string *)&headerfile);
  }
  bVar3 = (bool)(bVar17 ^ 1);
LAB_001487c5:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&classes);
  kwssys::RegularExpression::~RegularExpression(&regex);
  return bVar3;
}

Assistant:

bool Parser::CheckMemberFunctions(const char* regEx,unsigned long maxLength)
{
  m_TestsDone[MEMBERFUNCTION_REGEX] = true;
  m_TestsDescription[MEMBERFUNCTION_REGEX] = "Member functions should match regular expression: ";
  m_TestsDescription[MEMBERFUNCTION_REGEX] += regEx;

  if(maxLength>0)
    {
    m_TestsDone[MEMBERFUNCTION_LENGTH] = true;
    m_TestsDescription[MEMBERFUNCTION_LENGTH] = "Member functions must not exceed: ";
    m_TestsDescription[MEMBERFUNCTION_LENGTH] += std::to_string(maxLength);
    m_TestsDescription[MEMBERFUNCTION_LENGTH] += " lines";
    }

  // First we need to find the parameters
  bool hasError = false;

  kwssys::RegularExpression regex(regEx);

  // Construct the list of classnames to check
  std::vector<std::string> classes;

  // We first read the .h if any and not a .h file
  if(kwssys::SystemTools::GetFilenameExtension(m_Filename.c_str()) != ".h")
    {
    std::string headerfile = kwssys::SystemTools::GetFilenamePath(m_Filename.c_str());
    //headerfile += "/";
    headerfile += kwssys::SystemTools::GetFilenameWithoutExtension(m_Filename.c_str());
    headerfile += ".h";

    if(kwssys::SystemTools::FileExists(headerfile.c_str()))
      {
      // We open the file
      std::ifstream file;
      file.open(headerfile.c_str(), std::ios::binary | std::ios::in);
      if(!file.is_open())
        {
        std::cout << "Cannot open file: " << headerfile.c_str() << std::endl;
        return true;
        }

      file.seekg(0,std::ios::end);
      unsigned long fileSize = file.tellg();
      file.seekg(0,std::ios::beg);

      char* buf = new char[fileSize+1];
      file.read(buf,fileSize);
      buf[fileSize] = 0;
      std::string buffer(buf);
      buffer.resize(fileSize);
      delete [] buf;

      file.close();

      this->ConvertBufferToWindowsFileType(buffer);
      buffer = this->RemoveComments(buffer.c_str());

      size_t classpos = this->GetClassPosition(0,buffer);
      while(classpos!=std::string::npos)
        {
        std::string classname = this->FindPreviousWord(classpos,false,buffer);
        if(buffer[classpos-1] != ' '
          && m_BufferNoComment[classpos-1] != '\n')
          {
          classname = "";
          size_t i=classpos-1;
          while(i!=std::string::npos && buffer[i] != ' ')
            {
            classname = buffer[i]+classname;
            i--;
            }
          }
        classes.push_back(classname);
        classpos = this->GetClassPosition(classpos+1,buffer);
        }
      }
    }

  // Check the current file for any classes
  // And check the name of the current files
  size_t classpos = this->GetClassPosition(0);
  while(classpos!=std::string::npos)
    {
    size_t current;
    std::string memberFunction =
            this->FindMemberFunction(m_BufferNoComment,classpos,
                                     this->FindEndOfClass(classpos+1),current);

    std::string classname = this->FindPreviousWord(classpos);

    if(m_BufferNoComment[classpos-1] != ' '
      && m_BufferNoComment[classpos-1] != '\n'
      )
      {
      classname = "";
      size_t i=classpos-1;
      while(i!=std::string::npos && m_BufferNoComment[i] != ' ')
        {
        classname = m_BufferNoComment[i]+classname;
        i--;
        }
      }
    std::string destructor = "~";
    destructor += classname;

    while(current!=std::string::npos)
      {
      // if the member function is a constructor or destructor we ignore
      if(memberFunction != classname
        && memberFunction != destructor
        )
        {
        if(!regex.find(memberFunction))
          {
          Error error;
          error.line = this->GetLineNumber(current,true);
          error.line2 = error.line;
          error.number = MEMBERFUNCTION_REGEX;
          error.description = "member function (" + memberFunction + ") doesn't match regular expression";
          m_ErrorList.push_back(error);
          hasError = true;
          }

        // Check the size of the current memberFunction
        if(maxLength>0 && current!=std::string::npos)
          {
          size_t open = m_BufferNoComment.find("{",current);
          size_t semicolon = m_BufferNoComment.find(";",current);
          if(semicolon>open)
            {
            size_t close = this->FindClosingChar('{','}',open,true);
            size_t lopen = this->GetLineNumber(open);
            size_t lclose = this->GetLineNumber(close);
            if((open!=std::string::npos) && (close!=std::string::npos) && (lclose-lopen>maxLength))
              {
              Error error;
              error.line = this->GetLineNumber(current,true);
              error.line2 = error.line;
              error.number = MEMBERFUNCTION_LENGTH;
              error.description = "function (" + memberFunction + ") has too many lines: ";
              constexpr size_t length = 10;
              char* temp = new char[length];
              snprintf(temp,length,"%zd",lclose-lopen);
              error.description += temp;
              error.description += " (";
              snprintf(temp,length,"%ld",maxLength);
              error.description += temp;
              error.description += ")";
              m_ErrorList.push_back(error);
              hasError = true;
              delete [] temp;
              }
            }
          }
        }
      memberFunction = this->FindMemberFunction(m_BufferNoComment,current+1,this->FindEndOfClass(classpos+1),current);
      }
    classes.push_back(classname);
    classpos = this->GetClassPosition(classpos+1);
    }

  // Do the checking for the implementation file
  std::vector<std::string>::const_iterator it = classes.begin();
  while(it != classes.end())
    {
    std::string classname = (*it);

    // Search all the classname::
    size_t pos = m_BufferNoComment.find(classname,0);
    while(pos != std::string::npos)
      {
      // look for ::
      size_t pos2 = m_BufferNoComment.find("::",pos);
      bool valid = false;
      if(pos2 != std::string::npos)
        {
        valid = true;
        for(size_t i=pos+classname.size();i<pos2;i++)
          {
          if(m_BufferNoComment[i] != ' ' && m_BufferNoComment[i] != '\n' && m_BufferNoComment[i] != '\r')
            {
            valid = false;
            break;
            }
          }
        }

      // if we have a match we look for the name
      if(valid)
        {
        size_t i=pos2+2;
        while(i<m_BufferNoComment.size() &&
             (m_BufferNoComment[i] == ' '
             || m_BufferNoComment[i] == '\n'
             || m_BufferNoComment[i] == '\r'))
          {
          i++;
          }

       size_t pos3 = m_BufferNoComment.find("(",i);
       if(pos3 != std::string::npos)
         {
         std::string functionName = m_BufferNoComment.substr(i,pos3-i);
         std::string destructor = "~";
         destructor += classname;

         std::string functionLine = this->GetLine(this->GetLineNumber(i,true)-1);

         // if the member function is a constructor or destructor we ignore
         if(functionName != classname
           && functionName != destructor
           && functionLine.find("typedef ") == std::string::npos
           )
           {
           if(!regex.find(functionName))
             {
             Error error;
             error.line = this->GetLineNumber(i,true);
             error.line2 = error.line;
             error.number = MEMBERFUNCTION_REGEX;
             error.description = "function (" + functionName + ") doesn't match regular expression";
             m_ErrorList.push_back(error);
             hasError = true;
             }

           if(maxLength>0)
             {
             size_t open = m_BufferNoComment.find("{",i);
             size_t close = this->FindClosingChar('{','}',open,true);
             size_t lopen = this->GetLineNumber(open);
             size_t lclose = this->GetLineNumber(close);
             if((open!=std::string::npos) && (close!=std::string::npos)
                && (lclose-lopen>maxLength))
               {
               Error error;
               error.line = this->GetLineNumber(pos3,true);
               error.line2 = error.line;
               error.number = MEMBERFUNCTION_LENGTH;
               error.description = "function (" + functionName + ") has too many lines: ";
               constexpr size_t length = 10;
               char* temp = new char[length];
               snprintf(temp,length,"%zd",lclose-lopen);
               error.description += temp;
               error.description += " (";
               snprintf(temp,length,"%ld",maxLength);
               error.description += temp;
               error.description += ")";
               m_ErrorList.push_back(error);
               hasError = true;
               delete [] temp;
               }
             }
           }
         }
        }
      pos = m_BufferNoComment.find(classname,pos+1);
      }
    it++;
    }

  return !hasError;
}